

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O0

CURLcode Curl_sha512_256_init(void *context)

{
  EVP_MD_CTX *ctx_00;
  int iVar1;
  undefined8 uVar2;
  EVP_MD *type;
  Curl_sha512_256_ctx *ctx;
  void *context_local;
  
  uVar2 = EVP_MD_CTX_new();
  *(undefined8 *)context = uVar2;
  if (*context == 0) {
    context_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    ctx_00 = *context;
    type = (EVP_MD *)EVP_sha512_256();
    iVar1 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0);
    if (iVar1 == 0) {
      EVP_MD_CTX_free(*context);
      context_local._4_4_ = CURLE_FAILED_INIT;
    }
    else {
      context_local._4_4_ = CURLE_OK;
    }
  }
  return context_local._4_4_;
}

Assistant:

static CURLcode
Curl_sha512_256_init(void *context)
{
  Curl_sha512_256_ctx *const ctx = (Curl_sha512_256_ctx *)context;

  *ctx = EVP_MD_CTX_create();
  if(!*ctx)
    return CURLE_OUT_OF_MEMORY;

  if(EVP_DigestInit_ex(*ctx, EVP_sha512_256(), NULL)) {
    /* Check whether the header and this file use the same numbers */
    DEBUGASSERT(EVP_MD_CTX_size(*ctx) == CURL_SHA512_256_DIGEST_SIZE);
    /* Check whether the block size is correct */
    DEBUGASSERT(EVP_MD_CTX_block_size(*ctx) == CURL_SHA512_256_BLOCK_SIZE);

    return CURLE_OK; /* Success */
  }

  /* Cleanup */
  EVP_MD_CTX_destroy(*ctx);
  return CURLE_FAILED_INIT;
}